

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O0

void __thiscall mathOps_multDivReciprocity_Test::TestBody(mathOps_multDivReciprocity_Test *this)

{
  unit *puVar1;
  unit *puVar2;
  unit *puVar3;
  bool bVar4;
  char *pcVar5;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_10;
  Message local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_9;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_8;
  Message local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_7;
  Message local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_6;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_5;
  Message local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_4;
  Message local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_1c0 [8];
  measurement nm4b;
  undefined1 local_1a0 [8];
  measurement nm3b;
  undefined1 local_180 [8];
  measurement nm2b2;
  undefined1 local_160 [8];
  measurement nm2b;
  undefined1 local_140 [8];
  measurement nm1b;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8 [3];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  undefined1 local_b0 [8];
  measurement nm4;
  undefined1 local_90 [8];
  measurement nm3;
  undefined1 local_70 [8];
  measurement nm2;
  undefined1 local_50 [8];
  measurement nm1;
  measurement nMass;
  measurement kgT;
  measurement kg1;
  mathOps_multDivReciprocity_Test *this_local;
  
  puVar1 = &kgT.units_;
  units::measurement::measurement((measurement *)puVar1,0.02,(unit *)&units::g);
  puVar2 = &nMass.units_;
  units::measurement::measurement((measurement *)puVar2,3.4,(unit *)&units::ton);
  puVar3 = &nm1.units_;
  units::measurement::measurement((measurement *)puVar3,247.5,(unit *)&units::lb);
  join_0x00000000_0x00001200_ =
       units::measurement::operator/((measurement *)puVar1,(measurement *)puVar2);
  _local_50 = units::measurement::operator*((measurement *)&nm2.units_,(measurement *)puVar3);
  join_0x00000000_0x00001200_ =
       units::measurement::operator/((measurement *)puVar3,(measurement *)puVar2);
  _local_70 = units::measurement::operator*((measurement *)&nm3.units_,(measurement *)puVar1);
  join_0x00000000_0x00001200_ =
       units::measurement::operator*((measurement *)puVar1,(measurement *)puVar3);
  _local_90 = units::measurement::operator/((measurement *)&nm4.units_,(measurement *)puVar2);
  join_0x00000000_0x00001200_ =
       units::measurement::operator/((measurement *)puVar1,(measurement *)puVar2);
  _local_b0 = units::measurement::operator*((measurement *)puVar3,(measurement *)&gtest_ar.message_)
  ;
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_d0,"nm1","nm2",(measurement *)local_50,(measurement *)local_70);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar4) {
    testing::Message::Message(local_e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x102,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_100,"nm1","nm3",(measurement *)local_50,(measurement *)local_90);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar4) {
    testing::Message::Message(&local_108);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x103,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_120,"nm2","nm4",(measurement *)local_70,(measurement *)local_b0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar4) {
    testing::Message::Message(&local_128);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&nm1b.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x104,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&nm1b.units_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nm1b.units_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  puVar1 = &kgT.units_;
  puVar2 = &nMass.units_;
  join_0x00000000_0x00001200_ =
       units::divides<units::measurement,units::measurement,void>
                 ((measurement *)puVar1,(measurement *)puVar2);
  puVar3 = &nm1.units_;
  _local_140 = units::multiplies<units::measurement,units::measurement,void>
                         ((measurement *)&nm2b.units_,(measurement *)puVar3);
  join_0x00000000_0x00001200_ =
       units::divides<units::measurement,units::measurement,void>
                 ((measurement *)puVar3,(measurement *)puVar2);
  _local_160 = units::multiplies<units::measurement,units::measurement,void>
                         ((measurement *)&nm2b2.units_,(measurement *)puVar1);
  join_0x00000000_0x00001200_ =
       units::divides<units::measurement,units::measurement,void>
                 ((measurement *)puVar3,(measurement *)puVar2);
  _local_180 = units::multiplies<units::measurement,units::measurement,void>
                         ((measurement *)puVar1,(measurement *)&nm3b.units_);
  join_0x00000000_0x00001200_ =
       units::multiplies<units::measurement,units::measurement,void>
                 ((measurement *)puVar1,(measurement *)puVar3);
  _local_1a0 = units::divides<units::measurement,units::measurement,void>
                         ((measurement *)&nm4b.units_,(measurement *)puVar2);
  join_0x00000000_0x00001200_ =
       units::divides<units::measurement,units::measurement,void>
                 ((measurement *)puVar1,(measurement *)puVar2);
  _local_1c0 = units::multiplies<units::measurement,units::measurement,void>
                         ((measurement *)puVar3,(measurement *)&gtest_ar_3.message_);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_1e0,"nm1b","nm2b",(measurement *)local_140,(measurement *)local_160);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar4) {
    testing::Message::Message(&local_1e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x10c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_200,"nm2b","nm2b2",(measurement *)local_160,(measurement *)local_180)
  ;
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar4) {
    testing::Message::Message(&local_208);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x10d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_220,"nm1b","nm3b",(measurement *)local_140,(measurement *)local_1a0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar4) {
    testing::Message::Message(&local_228);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x10e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_240,"nm2b","nm4b",(measurement *)local_160,(measurement *)local_1c0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar4) {
    testing::Message::Message(&local_248);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x10f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_260,"nm1","nm1b",(measurement *)local_50,(measurement *)local_140);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar4) {
    testing::Message::Message(&local_268);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x111,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_280,"nm2","nm2b",(measurement *)local_70,(measurement *)local_160);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar4) {
    testing::Message::Message(&local_288);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x112,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_2a0,"nm3","nm3b",(measurement *)local_90,(measurement *)local_1a0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar4) {
    testing::Message::Message(&local_2a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x113,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_2c0,"nm4","nm4b",(measurement *)local_b0,(measurement *)local_1c0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar4) {
    testing::Message::Message(&local_2c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x114,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  return;
}

Assistant:

TEST(mathOps, multDivReciprocity)
{
    measurement kg1(0.02, g);
    measurement kgT(3.4, ton);
    measurement nMass(247.5, lb);

    auto nm1 = (kg1 / kgT) * nMass;
    auto nm2 = (nMass / kgT * kg1);
    auto nm3 = kg1 * nMass / kgT;
    auto nm4 = nMass * (kg1 / kgT);

    EXPECT_EQ(nm1, nm2);
    EXPECT_EQ(nm1, nm3);
    EXPECT_EQ(nm2, nm4);

    auto nm1b = multiplies(divides(kg1, kgT), nMass);
    auto nm2b = multiplies(divides(nMass, kgT), kg1);
    auto nm2b2 = multiplies(kg1, divides(nMass, kgT));
    auto nm3b = divides(multiplies(kg1, nMass), kgT);
    auto nm4b = multiplies(nMass, divides(kg1, kgT));

    EXPECT_EQ(nm1b, nm2b);
    EXPECT_EQ(nm2b, nm2b2);
    EXPECT_EQ(nm1b, nm3b);
    EXPECT_EQ(nm2b, nm4b);

    EXPECT_EQ(nm1, nm1b);
    EXPECT_EQ(nm2, nm2b);
    EXPECT_EQ(nm3, nm3b);
    EXPECT_EQ(nm4, nm4b);
}